

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void QPDF::compute_encryption_parameters_V5
               (char *user_password,char *owner_password,int V,int R,int key_len,int P,
               bool encrypt_metadata,string *id1,string *encryption_key,string *O,string *U,
               string *OE,string *UE,string *Perms)

{
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator local_229;
  string local_228 [32];
  uchar local_208 [8];
  uchar k [32];
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  EncryptionData data;
  bool encrypt_metadata_local;
  int P_local;
  int key_len_local;
  int R_local;
  int V_local;
  char *owner_password_local;
  char *user_password_local;
  
  data._215_1_ = encrypt_metadata;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
  EncryptionData::EncryptionData
            ((EncryptionData *)local_108,V,R,key_len,P,&local_128,&local_160,&local_188,&local_1b0,
             &local_1d8,id1,(bool)(data._215_1_ & 1));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  QUtil::initializeWithRandomBytes(local_208,0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,(char *)local_208,0x20,&local_229);
  std::__cxx11::string::operator=((string *)encryption_key,local_228);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,user_password,&local_251);
  compute_U_UE_value_V5(&local_250,encryption_key,(EncryptionData *)local_108,U,UE);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,owner_password,&local_279)
  ;
  compute_O_OE_value_V5(&local_278,encryption_key,(EncryptionData *)local_108,U,O,OE);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  compute_Perms_value_V5(&local_2a0,encryption_key,(EncryptionData *)local_108);
  std::__cxx11::string::operator=((string *)Perms,(string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  EncryptionData::setV5EncryptionParameters((EncryptionData *)local_108,O,OE,U,UE,Perms);
  EncryptionData::~EncryptionData((EncryptionData *)local_108);
  return;
}

Assistant:

void
QPDF::compute_encryption_parameters_V5(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    int P,
    bool encrypt_metadata,
    std::string const& id1,
    std::string& encryption_key,
    std::string& O,
    std::string& U,
    std::string& OE,
    std::string& UE,
    std::string& Perms)
{
    EncryptionData data(V, R, key_len, P, "", "", "", "", "", id1, encrypt_metadata);
    unsigned char k[key_bytes];
    QUtil::initializeWithRandomBytes(k, key_bytes);
    encryption_key = std::string(reinterpret_cast<char*>(k), key_bytes);
    compute_U_UE_value_V5(user_password, encryption_key, data, U, UE);
    compute_O_OE_value_V5(owner_password, encryption_key, data, U, O, OE);
    Perms = compute_Perms_value_V5(encryption_key, data);
    data.setV5EncryptionParameters(O, OE, U, UE, Perms);
}